

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_start_connect(SSL_HANDSHAKE *hs)

{
  SSL *ssl_00;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  pointer psVar6;
  uchar *buf;
  size_t sVar7;
  ssl_early_data_reason_t sVar8;
  ulong uVar9;
  undefined7 uVar10;
  Span<const_unsigned_char> enc;
  byte local_e1;
  byte local_d5;
  Span<unsigned_char> local_b0;
  SSL_HANDSHAKE *local_a0;
  uchar *local_98;
  ssl_early_data_reason_t local_8c;
  byte local_85;
  ssl_early_data_reason_t reason;
  undefined1 auStack_80 [3];
  bool enable_compatibility_mode;
  SSLSessionType session_type;
  size_t local_70;
  size_t ech_enc_len;
  uint8_t ech_enc [65];
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  unique0x00012000 = hs->ssl;
  ssl_do_info_callback(unique0x00012000,0x10,1);
  *(ushort *)&stack0xffffffffffffffe0->s3->field_0xdc =
       *(ushort *)&stack0xffffffffffffffe0->s3->field_0xdc & 0xffdf;
  bVar1 = ssl_get_version_range(hs,&hs->min_version,&hs->max_version);
  if (!bVar1) {
    return ssl_hs_error;
  }
  Span<unsigned_char>::Span<65ul>((Span<unsigned_char> *)auStack_80,(uchar (*) [65])&ech_enc_len);
  bVar1 = ssl_select_ech_config(hs,_auStack_80,&local_70);
  if (!bVar1) {
    return ssl_hs_error;
  }
  iVar3 = SSL_is_dtls(hs->ssl);
  if (iVar3 == 0) {
    if (hs->max_version < 0x303) {
      uVar2 = hs->max_version;
    }
    else {
      uVar2 = 0x303;
    }
    hs->client_version = uVar2;
  }
  else {
    uVar2 = 0xfeff;
    if (0x302 < hs->max_version) {
      uVar2 = 0xfefd;
    }
    hs->client_version = uVar2;
  }
  bVar1 = ssl_setup_pake_shares(hs);
  if (!bVar1) {
    return ssl_hs_error;
  }
  reason = ssl_early_data_unknown;
  bVar1 = std::operator!=(&stack0xffffffffffffffe0->session,(nullptr_t)0x0);
  if (!bVar1) goto LAB_0017a61c;
  psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                     (&stack0xffffffffffffffe0->session);
  reason = ssl_session_get_type(psVar6);
  psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                     (&stack0xffffffffffffffe0->session);
  if (((byte)psVar6->field_0x1b8 >> 4 & 1) == 0) {
    psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                       (&stack0xffffffffffffffe0->session);
    bVar1 = ssl_supports_version(hs,psVar6->ssl_version);
    if (bVar1) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->selected_ech_config);
      if (bVar1) {
        psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                           (&stack0xffffffffffffffe0->session);
        uVar2 = ssl_session_protocol_version(psVar6);
        if (uVar2 < 0x304) goto LAB_0017a606;
      }
      if ((reason != ssl_early_data_unknown) &&
         (((reason != ssl_early_data_accepted ||
           (uVar4 = SSL_get_options(stack0xffffffffffffffe0), (uVar4 & 0x4000) == 0)) &&
          (bVar1 = std::operator!=(&hs->pake_prover,(nullptr_t)0x0),
          ssl_00 = stack0xffffffffffffffe0, !bVar1)))) {
        psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                           (&stack0xffffffffffffffe0->session);
        bVar1 = ssl_session_is_time_valid(ssl_00,psVar6);
        if (bVar1) {
          uVar5 = SSL_is_quic(stack0xffffffffffffffe0);
          psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                             (&stack0xffffffffffffffe0->session);
          if ((uVar5 == ((byte)psVar6->field_0x1b8 >> 5 & 1)) &&
             ((*(ushort *)&stack0xffffffffffffffe0->s3->field_0xdc >> 4 & 1) == 0))
          goto LAB_0017a61c;
        }
      }
    }
  }
LAB_0017a606:
  ssl_set_session(stack0xffffffffffffffe0,(SSL_SESSION *)0x0);
  reason = ssl_early_data_unknown;
LAB_0017a61c:
  iVar3 = RAND_bytes(stack0xffffffffffffffe0->s3->client_random,0x20);
  if (iVar3 == 0) {
    hs_local._4_4_ = ssl_hs_error;
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->selected_ech_config);
    if ((bVar1) && (iVar3 = RAND_bytes(hs->inner_client_random,0x20), iVar3 == 0)) {
      hs_local._4_4_ = ssl_hs_error;
    }
    else {
      local_d5 = 0;
      if (0x303 < hs->max_version) {
        iVar3 = SSL_is_quic(stack0xffffffffffffffe0);
        local_d5 = 0;
        if (iVar3 == 0) {
          iVar3 = SSL_is_dtls(stack0xffffffffffffffe0);
          local_d5 = iVar3 != 0 ^ 0xff;
        }
      }
      local_85 = local_d5 & 1;
      if (reason == ssl_early_data_disabled) {
        psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           (&stack0xffffffffffffffe0->session);
        InplaceVector<unsigned_char,_32UL>::operator=(&hs->session_id,&psVar6->session_id);
      }
      else if ((reason == ssl_early_data_accepted) || (local_85 != 0)) {
        InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite(&hs->session_id,0x20);
        buf = InplaceVector<unsigned_char,_32UL>::data(&hs->session_id);
        sVar7 = InplaceVector<unsigned_char,_32UL>::size(&hs->session_id);
        iVar3 = RAND_bytes(buf,(int)sVar7);
        if (iVar3 == 0) {
          return ssl_hs_error;
        }
      }
      local_8c = should_offer_early_data(hs);
      if (local_8c == ssl_early_data_accepted) {
        sVar8 = *(ssl_early_data_reason_t *)&hs->field_0x6c8 & 0xfffff7ff | 0x800;
        *(ssl_early_data_reason_t *)&hs->field_0x6c8 = sVar8;
      }
      else {
        stack0xffffffffffffffe0->s3->early_data_reason = local_8c;
        sVar8 = local_8c;
      }
      uVar9 = (ulong)sVar8;
      bVar1 = ssl_setup_key_shares(hs,0);
      uVar10 = (undefined7)(uVar9 >> 8);
      local_e1 = 1;
      if (bVar1) {
        bVar1 = ssl_setup_extension_permutation(hs);
        sVar7 = CONCAT71(uVar10,bVar1);
        local_e1 = 1;
        if (bVar1) {
          Span<unsigned_char>::Span(&local_b0,(uchar *)&ech_enc_len,local_70);
          Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                    ((Span<unsigned_char_const> *)&local_a0,&local_b0);
          enc.size_ = sVar7;
          enc.data_ = local_98;
          bVar1 = ssl_encrypt_client_hello((bssl *)hs,local_a0,enc);
          local_e1 = 1;
          if (bVar1) {
            bVar1 = ssl_add_client_hello(hs);
            local_e1 = bVar1 ^ 0xff;
          }
        }
      }
      if ((local_e1 & 1) == 0) {
        hs->state = 1;
        hs_local._4_4_ = ssl_hs_flush;
      }
      else {
        hs_local._4_4_ = ssl_hs_error;
      }
    }
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_start_connect(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;

  ssl_do_info_callback(ssl, SSL_CB_HANDSHAKE_START, 1);
  // |session_reused| must be reset in case this is a renegotiation.
  ssl->s3->session_reused = false;

  // Freeze the version range.
  if (!ssl_get_version_range(hs, &hs->min_version, &hs->max_version)) {
    return ssl_hs_error;
  }

  uint8_t ech_enc[EVP_HPKE_MAX_ENC_LENGTH];
  size_t ech_enc_len;
  if (!ssl_select_ech_config(hs, ech_enc, &ech_enc_len)) {
    return ssl_hs_error;
  }

  // Always advertise the ClientHello version from the original maximum version,
  // even on renegotiation. The static RSA key exchange uses this field, and
  // some servers fail when it changes across handshakes.
  if (SSL_is_dtls(hs->ssl)) {
    hs->client_version =
        hs->max_version >= TLS1_2_VERSION ? DTLS1_2_VERSION : DTLS1_VERSION;
  } else {
    hs->client_version =
        hs->max_version >= TLS1_2_VERSION ? TLS1_2_VERSION : hs->max_version;
  }

  if (!ssl_setup_pake_shares(hs)) {
    return ssl_hs_error;
  }

  // If the configured session has expired or is not usable, drop it. We also do
  // not offer sessions on renegotiation.
  SSLSessionType session_type = SSLSessionType::kNotResumable;
  if (ssl->session != nullptr) {
    session_type = ssl_session_get_type(ssl->session.get());
    if (ssl->session->is_server ||
        !ssl_supports_version(hs, ssl->session->ssl_version) ||
        // Do not offer TLS 1.2 sessions with ECH. ClientHelloInner does not
        // offer TLS 1.2, and the cleartext session ID may leak the server
        // identity.
        (hs->selected_ech_config &&
         ssl_session_protocol_version(ssl->session.get()) < TLS1_3_VERSION) ||
        session_type == SSLSessionType::kNotResumable ||
        // Don't offer TLS 1.2 tickets if disabled.
        (session_type == SSLSessionType::kTicket &&
         (SSL_get_options(ssl) & SSL_OP_NO_TICKET)) ||
        // Don't offer sessions and PAKEs at the same time. We do not currently
        // support resumption with PAKEs. (Offering both together would need
        // more logic to conditionally send the key_share extension.)
        hs->pake_prover != nullptr ||
        !ssl_session_is_time_valid(ssl, ssl->session.get()) ||
        SSL_is_quic(ssl) != int{ssl->session->is_quic} ||
        ssl->s3->initial_handshake_complete) {
      ssl_set_session(ssl, nullptr);
      session_type = SSLSessionType::kNotResumable;
    }
  }

  if (!RAND_bytes(ssl->s3->client_random, sizeof(ssl->s3->client_random))) {
    return ssl_hs_error;
  }
  if (hs->selected_ech_config &&
      !RAND_bytes(hs->inner_client_random, sizeof(hs->inner_client_random))) {
    return ssl_hs_error;
  }

  // Compatibility mode sends a random session ID. Compatibility mode is
  // enabled for TLS 1.3, but not when it's run over QUIC or DTLS.
  const bool enable_compatibility_mode = hs->max_version >= TLS1_3_VERSION &&
                                         !SSL_is_quic(ssl) && !SSL_is_dtls(ssl);
  if (session_type == SSLSessionType::kID) {
    hs->session_id = ssl->session->session_id;
  } else if (session_type == SSLSessionType::kTicket ||
             enable_compatibility_mode) {
    // TLS 1.2 session tickets require a placeholder value to signal resumption.
    hs->session_id.ResizeForOverwrite(SSL_MAX_SSL_SESSION_ID_LENGTH);
    if (!RAND_bytes(hs->session_id.data(), hs->session_id.size())) {
      return ssl_hs_error;
    }
  }

  ssl_early_data_reason_t reason = should_offer_early_data(hs);
  if (reason != ssl_early_data_accepted) {
    ssl->s3->early_data_reason = reason;
  } else {
    hs->early_data_offered = true;
  }

  if (!ssl_setup_key_shares(hs, /*override_group_id=*/0) ||
      !ssl_setup_extension_permutation(hs) ||
      !ssl_encrypt_client_hello(hs, Span(ech_enc, ech_enc_len)) ||
      !ssl_add_client_hello(hs)) {
    return ssl_hs_error;
  }

  hs->state = state_enter_early_data;
  return ssl_hs_flush;
}